

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void setup_var_ref(gen_ctx_t gen_ctx,MIR_reg_t var,MIR_insn_t insn,size_t nop,size_t insn_num,
                  int def_p)

{
  VARR_var_ref_t *pVVar1;
  size_t sVar2;
  size_t sVar3;
  var_ref_t *pvVar4;
  combine_ctx *pcVar5;
  ulong uVar6;
  size_t *psVar7;
  ulong uVar8;
  char *op;
  
  if (var != 0xffffffff) {
    sVar2 = VARR_var_ref_tlength(gen_ctx->combine_ctx->var_refs);
    sVar3 = VARR_size_tlength(gen_ctx->combine_ctx->var_ref_ages);
    if (sVar2 != sVar3) {
      __assert_fail("(VARR_var_ref_tlength (gen_ctx->combine_ctx->var_refs)) == (VARR_size_tlength (gen_ctx->combine_ctx->var_ref_ages))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x22dc,
                    "void setup_var_ref(gen_ctx_t, MIR_reg_t, MIR_insn_t, size_t, size_t, int)");
    }
    sVar2 = VARR_var_ref_tlength(gen_ctx->combine_ctx->var_refs);
    uVar8 = (ulong)var;
    if (uVar8 < sVar2) {
      pcVar5 = gen_ctx->combine_ctx;
      pvVar4 = pcVar5->var_refs_addr;
      psVar7 = pcVar5->var_ref_ages_addr;
    }
    else {
      do {
        VARR_size_tpush(gen_ctx->combine_ctx->var_ref_ages,0);
        pVVar1 = gen_ctx->combine_ctx->var_refs;
        pvVar4 = pVVar1->varr;
        if (pvVar4 == (var_ref_t *)0x0) {
          op = "expand";
          goto LAB_001453b1;
        }
        sVar2 = pVVar1->els_num;
        uVar6 = sVar2 + 1;
        if (pVVar1->size < uVar6) {
          sVar2 = (uVar6 >> 1) + uVar6;
          pvVar4 = (var_ref_t *)realloc(pvVar4,sVar2 * 0x20);
          pVVar1->varr = pvVar4;
          pVVar1->size = sVar2;
          sVar2 = pVVar1->els_num;
          uVar6 = sVar2 + 1;
        }
        pVVar1->els_num = uVar6;
        pvVar4 = pvVar4 + sVar2;
        pvVar4->insn = (MIR_insn_t)0x0;
        pvVar4->insn_num = 0;
        pvVar4->nop = 0;
        pvVar4->def_p = '\0';
        pvVar4->del_p = '\0';
        *(undefined6 *)&pvVar4->field_0x1a = 0;
        sVar2 = VARR_var_ref_tlength(gen_ctx->combine_ctx->var_refs);
      } while (sVar2 <= uVar8);
      pcVar5 = gen_ctx->combine_ctx;
      if (pcVar5->var_refs == (VARR_var_ref_t *)0x0) {
        op = "addr";
LAB_001453b1:
        mir_varr_assert_fail(op,"var_ref_t");
      }
      pvVar4 = pcVar5->var_refs->varr;
      pcVar5->var_refs_addr = pvVar4;
      if (pcVar5->var_ref_ages == (VARR_size_t *)0x0) {
        mir_varr_assert_fail("addr","size_t");
      }
      psVar7 = pcVar5->var_ref_ages->varr;
      pcVar5->var_ref_ages_addr = psVar7;
    }
    psVar7[uVar8] = pcVar5->curr_bb_var_ref_age;
    pvVar4[uVar8].insn = insn;
    pvVar4[uVar8].nop = nop;
    pvVar4[uVar8].insn_num = insn_num;
    pvVar4[uVar8].def_p = (char)def_p;
    pvVar4[uVar8].del_p = '\0';
  }
  return;
}

Assistant:

static void setup_var_ref (gen_ctx_t gen_ctx, MIR_reg_t var, MIR_insn_t insn, size_t nop,
                           size_t insn_num, int def_p) {
  static const var_ref_t var_ref = {NULL, 0, 0, FALSE, FALSE};

  if (var == MIR_NON_VAR) return;
  gen_assert (VARR_LENGTH (var_ref_t, var_refs) == VARR_LENGTH (size_t, var_ref_ages));
  if (VARR_LENGTH (var_ref_t, var_refs) <= var) {
    do {
      VARR_PUSH (size_t, var_ref_ages, 0);
      VARR_PUSH (var_ref_t, var_refs, var_ref);
    } while (VARR_LENGTH (var_ref_t, var_refs) <= var);
    var_refs_addr = VARR_ADDR (var_ref_t, var_refs);
    var_ref_ages_addr = VARR_ADDR (size_t, var_ref_ages);
  }
  var_ref_ages_addr[var] = curr_bb_var_ref_age;
  var_refs_addr[var].insn = insn;
  var_refs_addr[var].nop = nop;
  var_refs_addr[var].insn_num = insn_num;
  var_refs_addr[var].def_p = def_p;
  var_refs_addr[var].del_p = FALSE;
}